

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionScale(Quaternion q,float mul)

{
  float qax;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Quaternion QVar8;
  
  fVar4 = q.w * mul;
  fVar6 = q.x * mul;
  fVar7 = q.y * mul;
  fVar5 = -q.z * mul;
  fVar2 = q.z * mul;
  fVar1 = -q.x * mul;
  fVar3 = -q.y * mul;
  QVar8.z = fVar2 + fVar4 + fVar6 + fVar3;
  QVar8.w = fVar1 + fVar4 + fVar3 + fVar5;
  QVar8.y = fVar7 + fVar4 + fVar2 + fVar1;
  QVar8.x = fVar6 + fVar4 + fVar7 + fVar5;
  return QVar8;
}

Assistant:

RMDEF Quaternion QuaternionScale(Quaternion q, float mul)
{
    Quaternion result = { 0 };

    float qax = q.x, qay = q.y, qaz = q.z, qaw = q.w;

    result.x = qax*mul + qaw*mul + qay*mul - qaz*mul;
    result.y = qay*mul + qaw*mul + qaz*mul - qax*mul;
    result.z = qaz*mul + qaw*mul + qax*mul - qay*mul;
    result.w = qaw*mul - qax*mul - qay*mul - qaz*mul;

    return result;
}